

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

void __thiscall toml::internal::Parser::Parser(Parser *this,istream *is)

{
  int iVar1;
  long *local_90;
  long local_88;
  long local_80 [2];
  TokenType local_70;
  long *local_68 [2];
  long local_58 [2];
  int64_t local_48;
  double dStack_40;
  rep local_38;
  
  (this->lexer_).is_ = is;
  (this->lexer_).lineNo_ = 1;
  (this->token_).type_ = ERROR_TOKEN;
  (this->token_).str_value_._M_dataplus._M_p = (pointer)&(this->token_).str_value_.field_2;
  (this->token_).str_value_._M_string_length = 0;
  (this->token_).str_value_.field_2._M_local_buf[0] = '\0';
  (this->token_).time_value_.__d.__r = 0;
  (this->errorReason_)._M_dataplus._M_p = (pointer)&(this->errorReason_).field_2;
  (this->errorReason_)._M_string_length = 0;
  (this->errorReason_).field_2._M_local_buf[0] = '\0';
  iVar1 = std::istream::peek();
  if (iVar1 == 0xef) {
    std::istream::get();
    iVar1 = std::istream::get();
    if (iVar1 == 0xbb) {
      iVar1 = std::istream::get();
      if (iVar1 == 0xbf) goto LAB_00157fc7;
    }
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Invalid UTF8 BOM","");
    local_70 = ERROR_TOKEN;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>((string *)local_68,local_90,local_88 + (long)local_90)
    ;
    local_38 = 0;
    (this->token_).type_ = local_70;
    std::__cxx11::string::operator=((string *)&(this->token_).str_value_,(string *)local_68);
    (this->token_).time_value_.__d.__r = local_38;
    (this->token_).int_value_ = local_48;
    (this->token_).double_value_ = dStack_40;
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
  }
  else {
LAB_00157fc7:
    nextKey(this);
  }
  return;
}

Assistant:

explicit Parser(std::istream& is) : lexer_(is), token_(TokenType::ERROR_TOKEN)
    {
        if (!lexer_.skipUTF8BOM()) {
            token_ = Token(TokenType::ERROR_TOKEN, std::string("Invalid UTF8 BOM"));
        } else {
            nextKey();
        }
    }